

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Admin.h
# Opt level: O3

void __thiscall Admin::resizeRooms(Admin *this)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  uint uVar3;
  Room *pRVar4;
  undefined1 auVar5 [16];
  int iVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  University *pUVar10;
  Room *pRVar11;
  void *pvVar12;
  ulong uVar13;
  long lVar14;
  
  pUVar10 = Innopolis;
  uVar3 = Innopolis->rooms_count;
  iVar6 = uVar3 * 2;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = (long)iVar6;
  uVar13 = 0xffffffffffffffff;
  if (SUB168(auVar5 * ZEXT816(0x28),8) == 0) {
    uVar13 = SUB168(auVar5 * ZEXT816(0x28),0);
  }
  pRVar11 = (Room *)operator_new__(uVar13);
  if ((ulong)uVar3 != 0) {
    lVar14 = 0;
    do {
      *(undefined8 *)((long)&pRVar11->standardAccess + lVar14) = 1;
      *(undefined4 *)((long)&pRVar11->specialAccessedUsers_count + lVar14) = 1;
      pvVar12 = operator_new__(4);
      *(void **)((long)&pRVar11->specialAccessedUsers + lVar14) = pvVar12;
      lVar14 = lVar14 + 0x28;
    } while ((long)iVar6 * 0x28 != lVar14);
    if (0 < (int)uVar3) {
      pRVar4 = pUVar10->rooms;
      lVar14 = 0;
      uVar13 = 0;
      do {
        *(undefined4 *)((long)&pRVar11->room_id + lVar14) =
             *(undefined4 *)((long)&pRVar4->room_id + lVar14);
        puVar1 = (undefined8 *)((long)&pRVar4->name + lVar14);
        uVar7 = *puVar1;
        uVar8 = puVar1[1];
        puVar1 = (undefined8 *)((long)&pRVar4->specialAccessedUsers_count + lVar14);
        uVar9 = puVar1[1];
        puVar2 = (undefined8 *)((long)&pRVar11->specialAccessedUsers_count + lVar14);
        *puVar2 = *puVar1;
        puVar2[1] = uVar9;
        puVar1 = (undefined8 *)((long)&pRVar11->name + lVar14);
        *puVar1 = uVar7;
        puVar1[1] = uVar8;
        uVar13 = uVar13 + 1;
        lVar14 = lVar14 + 0x28;
      } while (uVar13 < uVar3);
    }
  }
  pUVar10->rooms_count = iVar6;
  pUVar10->rooms = pRVar11;
  return;
}

Assistant:

void resizeRooms(){
        Room* resizesRoomList = new Room[Innopolis->rooms_count*2];
        for(int i=0;i<Innopolis->rooms_count;i++){
            resizesRoomList[i] = Innopolis->rooms[i];
        }
        Innopolis->rooms_count<<=1;
        Innopolis->rooms = resizesRoomList;
    }